

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

uint32_t __thiscall mjs::to_uint32(mjs *this,double n)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double max;
  double n_local;
  
  uVar1 = std::isnan(n);
  if (((uVar1 & 1) == 0) && (((n != 0.0 || (NAN(n))) && (uVar1 = std::isinf(n), (uVar1 & 1) == 0))))
  {
    dVar2 = to_integer_inner(this,n);
    dVar3 = floor(dVar2 / 4294967296.0);
    dVar2 = dVar3 * -4294967296.0 + dVar2;
    if (dVar2 < 0.0 || 4294967296.0 <= dVar2) {
      __assert_fail("n >= 0.0 && n < max",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                    ,200,"uint32_t mjs::to_uint32(double)");
    }
    n_local._4_4_ = (uint32_t)(long)dVar2;
  }
  else {
    n_local._4_4_ = 0;
  }
  return n_local._4_4_;
}

Assistant:

uint32_t to_uint32(double n) {
    if (std::isnan(n) || n == 0 || std::isinf(n)) {
        return 0;
    }
    n = to_integer_inner(n);
    constexpr double max = 1ULL << 32;
    n = n - max * std::floor(n / max);
    assert(n >= 0.0 && n < max);
    return static_cast<uint32_t>(n);
}